

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O2

void resolve_common_syms(TCCState *s1)

{
  char *pcVar1;
  char cVar2;
  Section *pSVar3;
  uchar *puVar4;
  size_t sVar5;
  char *pcVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  char local_438 [8];
  char buf [1024];
  
  puVar4 = symtab_section->data;
  puVar7 = puVar4;
  do {
    do {
      puVar8 = puVar7;
      puVar7 = puVar8 + 0x18;
      if (puVar4 + symtab_section->data_offset <= puVar7) {
        set_elf_sym(symtab_section,text_section->data_offset,0,0x10,0,text_section->sh_num,"_etext")
        ;
        set_elf_sym(symtab_section,data_section->data_offset,0,0x10,0,data_section->sh_num,"_edata")
        ;
        set_elf_sym(symtab_section,bss_section->data_offset,0,0x10,0,bss_section->sh_num,"_end");
        add_init_array_defines(s1,".preinit_array");
        add_init_array_defines(s1,".init_array");
        add_init_array_defines(s1,".fini_array");
        lVar9 = 1;
        goto LAB_0010fb30;
      }
    } while (*(short *)(puVar8 + 0x1e) != -0xe);
    sVar5 = section_add(bss_section,*(Elf64_Addr *)(puVar8 + 0x28),*(int *)(puVar8 + 0x20));
    *(size_t *)(puVar8 + 0x20) = sVar5;
    *(short *)(puVar8 + 0x1e) = (short)bss_section->sh_num;
    puVar4 = symtab_section->data;
  } while( true );
LAB_0010fb30:
  if (s1->nb_sections <= lVar9) {
    return;
  }
  pSVar3 = s1->sections[lVar9];
  if ((pSVar3->sh_type == 1) && ((pSVar3->sh_flags & 2) != 0)) {
    pcVar1 = pSVar3->name;
    pcVar6 = pcVar1;
    do {
      cVar2 = *pcVar6;
      if (cVar2 == '\0') {
        snprintf(local_438,0x400,"__start_%s",pcVar1);
        set_elf_sym(symtab_section,0,0,0x10,0,pSVar3->sh_num,local_438);
        snprintf(local_438,0x400,"__stop_%s",pcVar1);
        set_elf_sym(symtab_section,pSVar3->data_offset,0,0x10,0,pSVar3->sh_num,local_438);
        break;
      }
      pcVar6 = pcVar6 + 1;
    } while ((0xfffffff5 < (int)cVar2 - 0x3aU || 0xffffffe5 < ((int)cVar2 & 0xffffffdfU) - 0x5b) ||
             cVar2 == '_');
  }
  lVar9 = lVar9 + 1;
  goto LAB_0010fb30;
}

Assistant:

ST_FUNC void resolve_common_syms(TCCState* s1) {
  ElfW(Sym) * sym;

  /* Allocate common symbols in BSS.  */
  for_each_elem(symtab_section, 1, sym, ElfW(Sym)) {
    if (sym->st_shndx == SHN_COMMON) {
      /* symbol alignment is in st_value for SHN_COMMONs */
      sym->st_value = section_add(bss_section, sym->st_size, sym->st_value);
      sym->st_shndx = bss_section->sh_num;
    }
  }

  /* Now assign linker provided symbols their value.  */
  tcc_add_linker_symbols(s1);
}